

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O1

int X509V3_bool_from_string(char *str,ASN1_BOOLEAN *out_bool)

{
  int iVar1;
  
  iVar1 = strcmp(str,"TRUE");
  if ((((iVar1 == 0) || (iVar1 = strcmp(str,"true"), iVar1 == 0)) ||
      (iVar1 = strcmp(str,"Y"), iVar1 == 0)) ||
     (((iVar1 = strcmp(str,"y"), iVar1 == 0 || (iVar1 = strcmp(str,"YES"), iVar1 == 0)) ||
      (iVar1 = strcmp(str,"yes"), iVar1 == 0)))) {
    *out_bool = 0xff;
  }
  else {
    iVar1 = strcmp(str,"FALSE");
    if (((iVar1 != 0) && (iVar1 = strcmp(str,"false"), iVar1 != 0)) &&
       ((iVar1 = strcmp(str,"N"), iVar1 != 0 &&
        (((iVar1 = strcmp(str,"n"), iVar1 != 0 && (iVar1 = strcmp(str,"NO"), iVar1 != 0)) &&
         (iVar1 = strcmp(str,"no"), iVar1 != 0)))))) {
      ERR_put_error(0x14,0,0x78,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_utl.cc"
                    ,0x109);
      return 0;
    }
    *out_bool = 0;
  }
  return 1;
}

Assistant:

int X509V3_bool_from_string(const char *str, ASN1_BOOLEAN *out_bool) {
  if (!strcmp(str, "TRUE") || !strcmp(str, "true") || !strcmp(str, "Y") ||
      !strcmp(str, "y") || !strcmp(str, "YES") || !strcmp(str, "yes")) {
    *out_bool = ASN1_BOOLEAN_TRUE;
    return 1;
  }
  if (!strcmp(str, "FALSE") || !strcmp(str, "false") || !strcmp(str, "N") ||
      !strcmp(str, "n") || !strcmp(str, "NO") || !strcmp(str, "no")) {
    *out_bool = ASN1_BOOLEAN_FALSE;
    return 1;
  }
  OPENSSL_PUT_ERROR(X509V3, X509V3_R_INVALID_BOOLEAN_STRING);
  return 0;
}